

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O2

iterator __thiscall
CPU::WDC65816::ProcessorStorageConstructor::install
          (ProcessorStorageConstructor *this,Generator generator,AccessType access_type)

{
  pointer pMVar1;
  _Rb_tree<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>,std::pair<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>const,std::pair<unsigned_long,unsigned_long>>>,std::less<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>>,std::allocator<std::pair<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>const,std::pair<unsigned_long,unsigned_long>>>>
  *this_00;
  iterator iVar2;
  pointer pMVar3;
  size_type __new_size;
  size_type sVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>,_std::pair<unsigned_long,_unsigned_long>_>_>,_bool>
  pVar5;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Rb_tree<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>,std::pair<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>const,std::pair<unsigned_long,unsigned_long>>>,std::less<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>>,std::allocator<std::pair<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>const,std::pair<unsigned_long,unsigned_long>>>>
  *local_38;
  
  local_58._8_4_ = access_type;
  local_58._M_unused._0_8_ = (undefined8)generator;
  iVar2._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>,_std::pair<const_std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>_>,_std::allocator<std::pair<const_std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
       ::find(&(this->installed_patterns)._M_t,(key_type *)&local_58);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->installed_patterns)._M_t._M_impl.super__Rb_tree_header) {
    sVar4 = (long)(this->storage_->micro_ops_).
                  super__Vector_base<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->storage_->micro_ops_).
                  super__Vector_base<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_58._8_8_ = 0;
    local_40 = std::
               _Function_handler<void_(CPU::WDC65816::MicroOp),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Processors/65816/Implementation/65816Storage.cpp:126:35)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(CPU::WDC65816::MicroOp),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Processors/65816/Implementation/65816Storage.cpp:126:35)>
               ::_M_manager;
    local_58._M_unused._M_object = this;
    local_38 = (_Rb_tree<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>,std::pair<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>const,std::pair<unsigned_long,unsigned_long>>>,std::less<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>>,std::allocator<std::pair<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>const,std::pair<unsigned_long,unsigned_long>>>>
                *)&this->installed_patterns;
    (*generator)(access_type,true,(function<void_(CPU::WDC65816::MicroOp)> *)&local_58);
    std::_Function_base::~_Function_base((_Function_base *)&local_58);
    local_58._M_pod_data[0] = 0x3a;
    std::vector<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>::
    emplace_back<CPU::WDC65816::MicroOp>
              (&this->storage_->micro_ops_,(MicroOp *)local_58._M_pod_data);
    __new_size = (long)(this->storage_->micro_ops_).
                       super__Vector_base<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->storage_->micro_ops_).
                       super__Vector_base<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>
                       ._M_impl.super__Vector_impl_data._M_start;
    local_58._8_8_ = 0;
    local_40 = std::
               _Function_handler<void_(CPU::WDC65816::MicroOp),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Processors/65816/Implementation/65816Storage.cpp:133:36)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(CPU::WDC65816::MicroOp),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Processors/65816/Implementation/65816Storage.cpp:133:36)>
               ::_M_manager;
    local_58._M_unused._M_object = this;
    (*generator)(access_type,false,(function<void_(CPU::WDC65816::MicroOp)> *)&local_58);
    std::_Function_base::~_Function_base((_Function_base *)&local_58);
    local_58._M_pod_data[0] = 0x3a;
    std::vector<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>::
    emplace_back<CPU::WDC65816::MicroOp>
              (&this->storage_->micro_ops_,(MicroOp *)local_58._M_pod_data);
    this_00 = local_38;
    pMVar3 = (this->storage_->micro_ops_).
             super__Vector_base<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      pMVar1 = pMVar3 + sVar4;
      if (*pMVar1 != pMVar3[__new_size]) goto LAB_0038e7ff;
      pMVar3 = pMVar3 + 1;
    } while (*pMVar1 != OperationMoveToNextProgram);
    std::vector<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>::resize
              (&this->storage_->micro_ops_,__new_size);
    __new_size = sVar4;
LAB_0038e7ff:
    local_58._0_4_ = access_type;
    local_58._8_8_ = generator;
    local_48 = (code *)sVar4;
    local_40 = (code *)__new_size;
    pVar5 = std::
            _Rb_tree<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>,std::pair<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>const,std::pair<unsigned_long,unsigned_long>>>,std::less<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>>,std::allocator<std::pair<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>const,std::pair<unsigned_long,unsigned_long>>>>
            ::
            _M_emplace_unique<std::pair<std::pair<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>,std::pair<unsigned_long,unsigned_long>>>
                      (this_00,(pair<std::pair<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>,_std::pair<unsigned_long,_unsigned_long>_>
                                *)&local_58);
    iVar2._M_node = (_Base_ptr)pVar5.first._M_node;
  }
  return (iterator)iVar2._M_node;
}

Assistant:

PatternTable::iterator install(Generator generator, AccessType access_type = AccessType::Read) {
		// Check whether this access type + addressing mode generator has already been generated.
		const auto key = std::make_pair(access_type, generator);
		const auto map_entry = installed_patterns.find(key);

		// If it wasn't found, generate it now in both 8- and 16-bit variants.
		// Otherwise, get the location of the existing entries.
		if(map_entry != installed_patterns.end()) {
			return map_entry;
		}

		// Generate 8-bit steps.
		const size_t micro_op_location_8 = storage_.micro_ops_.size();
		(*generator)(access_type, true, [this] (MicroOp op) {
			this->storage_.micro_ops_.push_back(op);
		});
		storage_.micro_ops_.push_back(OperationMoveToNextProgram);

		// Generate 16-bit steps.
		size_t micro_op_location_16 = storage_.micro_ops_.size();
		(*generator)(access_type, false, [this] (MicroOp op) {
			this->storage_.micro_ops_.push_back(op);
		});
		storage_.micro_ops_.push_back(OperationMoveToNextProgram);

		// Minor optimisation: elide the steps if 8- and 16-bit steps are equal.
		bool are_equal = true;
		size_t c = 0;
		while(true) {
			if(storage_.micro_ops_[micro_op_location_8 + c] != storage_.micro_ops_[micro_op_location_16 + c]) {
				are_equal = false;
				break;
			}
			if(storage_.micro_ops_[micro_op_location_8 + c] == OperationMoveToNextProgram) break;
			++c;
		}

		if(are_equal) {
			storage_.micro_ops_.resize(micro_op_location_16);
			micro_op_location_16 = micro_op_location_8;
		}

		// Insert into the map and return the resulting iterator.
		return installed_patterns.insert(std::make_pair(key, std::make_pair(micro_op_location_8, micro_op_location_16))).first;
	}